

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_constants_world(parser *p)

{
  undefined2 uVar1;
  wchar_t wVar2;
  int iVar3;
  void *pvVar4;
  char *__s1;
  wchar_t value;
  char *label;
  angband_constants *z;
  parser *p_local;
  
  pvVar4 = parser_priv(p);
  __s1 = parser_getsym(p,"label");
  wVar2 = parser_getint(p,"value");
  if (wVar2 < L'\0') {
    p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    iVar3 = strcmp(__s1,"max-depth");
    uVar1 = (undefined2)wVar2;
    if (iVar3 == 0) {
      *(undefined2 *)((long)pvVar4 + 0x5c) = uVar1;
    }
    else {
      iVar3 = strcmp(__s1,"day-length");
      if (iVar3 == 0) {
        *(undefined2 *)((long)pvVar4 + 0x5e) = uVar1;
      }
      else {
        iVar3 = strcmp(__s1,"dungeon-hgt");
        if (iVar3 == 0) {
          *(undefined2 *)((long)pvVar4 + 0x60) = uVar1;
        }
        else {
          iVar3 = strcmp(__s1,"dungeon-wid");
          if (iVar3 == 0) {
            *(undefined2 *)((long)pvVar4 + 0x62) = uVar1;
          }
          else {
            iVar3 = strcmp(__s1,"town-hgt");
            if (iVar3 == 0) {
              *(undefined2 *)((long)pvVar4 + 100) = uVar1;
            }
            else {
              iVar3 = strcmp(__s1,"town-wid");
              if (iVar3 == 0) {
                *(undefined2 *)((long)pvVar4 + 0x66) = uVar1;
              }
              else {
                iVar3 = strcmp(__s1,"feeling-total");
                if (iVar3 == 0) {
                  *(undefined2 *)((long)pvVar4 + 0x68) = uVar1;
                }
                else {
                  iVar3 = strcmp(__s1,"feeling-need");
                  if (iVar3 == 0) {
                    *(undefined2 *)((long)pvVar4 + 0x6a) = uVar1;
                  }
                  else {
                    iVar3 = strcmp(__s1,"stair-skip");
                    if (iVar3 == 0) {
                      *(undefined2 *)((long)pvVar4 + 0x6c) = uVar1;
                    }
                    else {
                      iVar3 = strcmp(__s1,"move-energy");
                      if (iVar3 != 0) {
                        return PARSE_ERROR_UNDEFINED_DIRECTIVE;
                      }
                      *(undefined2 *)((long)pvVar4 + 0x6e) = uVar1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_constants_world(struct parser *p) {
	struct angband_constants *z;
	const char *label;
	int value;

	z = parser_priv(p);
	label = parser_getsym(p, "label");
	value = parser_getint(p, "value");

	if (value < 0)
		return PARSE_ERROR_INVALID_VALUE;

	if (streq(label, "max-depth"))
		z->max_depth = value;
	else if (streq(label, "day-length"))
		z->day_length = value;
	else if (streq(label, "dungeon-hgt"))
		z->dungeon_hgt = value;
	else if (streq(label, "dungeon-wid"))
		z->dungeon_wid = value;
	else if (streq(label, "town-hgt"))
		z->town_hgt = value;
	else if (streq(label, "town-wid"))
		z->town_wid = value;
	else if (streq(label, "feeling-total"))
		z->feeling_total = value;
	else if (streq(label, "feeling-need"))
		z->feeling_need = value;
	else if (streq(label, "stair-skip"))
		z->stair_skip = value;
	else if (streq(label, "move-energy"))
		z->move_energy = value;
	else
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;

	return PARSE_ERROR_NONE;
}